

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::Segment::CreateInstance(IMkvReader *pReader,longlong pos,Segment **pSegment)

{
  int iVar1;
  longlong lVar2;
  Segment *this;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong idpos;
  longlong result;
  long len;
  long status;
  longlong available;
  longlong total;
  Segment *pSVar3;
  long *in_stack_ffffffffffffff78;
  longlong in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  longlong in_stack_ffffffffffffff90;
  IMkvReader *in_stack_ffffffffffffff98;
  IMkvReader *in_stack_ffffffffffffffa0;
  IMkvReader *in_stack_ffffffffffffffa8;
  long local_40;
  long local_30;
  long local_28;
  long *local_20;
  long local_18;
  long local_8;
  
  if ((in_RDI == (long *)0x0) || (in_RSI < 0)) {
    local_8 = -1;
  }
  else {
    *in_RDX = 0;
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar1 = (**(code **)(*in_RDI + 8))(in_RDI,&local_28,&local_30);
    local_8 = (long)iVar1;
    if (-1 < local_8) {
      if (local_30 < 0) {
        local_8 = -1;
      }
      else if ((local_28 < 0) || (local_30 <= local_28)) {
        while( true ) {
          if ((-1 < local_28) && (local_28 <= local_18)) {
            return -2;
          }
          lVar2 = GetUIntLength((IMkvReader *)
                                CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                                in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          if (lVar2 != 0) {
            return lVar2;
          }
          if ((-1 < local_28) && (local_28 < local_18 + local_40)) {
            return -2;
          }
          if (local_30 < local_18 + local_40) {
            return local_18 + local_40;
          }
          in_stack_ffffffffffffffa8 =
               (IMkvReader *)
               ReadID(in_stack_ffffffffffffffa8,(longlong)in_stack_ffffffffffffffa0,
                      (long *)in_stack_ffffffffffffff98);
          if ((long)in_stack_ffffffffffffffa8 < 0) {
            return -2;
          }
          local_18 = local_40 + local_18;
          lVar2 = GetUIntLength((IMkvReader *)
                                CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                                in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          if (lVar2 != 0) {
            return lVar2;
          }
          if ((-1 < local_28) && (local_28 < local_18 + local_40)) {
            return -2;
          }
          if (local_30 < local_18 + local_40) {
            return local_18 + local_40;
          }
          in_stack_ffffffffffffffa0 =
               (IMkvReader *)
               ReadUInt(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        (long *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
          if ((long)in_stack_ffffffffffffffa0 < 0) {
            return (longlong)in_stack_ffffffffffffffa0;
          }
          local_18 = local_40 + local_18;
          in_stack_ffffffffffffff98 = (IMkvReader *)((1L << ((char)local_40 * '\a' & 0x3fU)) + -1);
          if (in_stack_ffffffffffffffa8 == (IMkvReader *)0x18538067) {
            this = (Segment *)operator_new(200,(nothrow_t *)&std::nothrow);
            pSVar3 = (Segment *)0x0;
            if (this != (Segment *)0x0) {
              Segment(this,(IMkvReader *)CONCAT17(1,in_stack_ffffffffffffff88),
                      in_stack_ffffffffffffff80,(longlong)in_stack_ffffffffffffff78,0);
              pSVar3 = this;
            }
            *local_20 = (long)pSVar3;
            if (*local_20 == 0) {
              return -1;
            }
            return 0;
          }
          if (in_stack_ffffffffffffffa0 == in_stack_ffffffffffffff98) {
            return -2;
          }
          if ((-1 < local_28) &&
             (local_28 < (long)&in_stack_ffffffffffffffa0->_vptr_IMkvReader + local_18)) {
            return -2;
          }
          if (local_30 < (long)&in_stack_ffffffffffffffa0->_vptr_IMkvReader + local_18) break;
          local_18 = (long)&in_stack_ffffffffffffffa0->_vptr_IMkvReader + local_18;
        }
        local_8 = (long)&in_stack_ffffffffffffffa0->_vptr_IMkvReader + local_18;
      }
      else {
        local_8 = -1;
      }
    }
  }
  return local_8;
}

Assistant:

long long Segment::CreateInstance(IMkvReader* pReader, long long pos,
                                  Segment*& pSegment) {
  if (pReader == NULL || pos < 0)
    return E_PARSE_FAILED;

  pSegment = NULL;

  long long total, available;

  const long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (available < 0)
    return -1;

  if ((total >= 0) && (available > total))
    return -1;

  // I would assume that in practice this loop would execute
  // exactly once, but we allow for other elements (e.g. Void)
  // to immediately follow the EBML header.  This is fine for
  // the source filter case (since the entire file is available),
  // but in the splitter case over a network we should probably
  // just give up early.  We could for example decide only to
  // execute this loop a maximum of, say, 10 times.
  // TODO:
  // There is an implied "give up early" by only parsing up
  // to the available limit.  We do do that, but only if the
  // total file size is unknown.  We could decide to always
  // use what's available as our limit (irrespective of whether
  // we happen to know the total file length).  This would have
  // as its sense "parse this much of the file before giving up",
  // which a slightly different sense from "try to parse up to
  // 10 EMBL elements before giving up".

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return E_FILE_FORMAT_INVALID;

    // Read ID
    long len;
    long long result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return size;

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    // Handle "unknown size" for live streaming of webm files.
    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (id == libwebm::kMkvSegment) {
      if (size == unknown_size)
        size = -1;

      else if (total < 0)
        size = -1;

      else if ((pos + size) > total)
        size = -1;

      pSegment = new (std::nothrow) Segment(pReader, idpos, pos, size);
      if (pSegment == NULL)
        return E_PARSE_FAILED;

      return 0;  // success
    }

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + size) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + size) > available)
      return pos + size;

    pos += size;  // consume payload
  }
}